

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t * Gia_ManSimPatStart(int nItems)

{
  Vec_Int_t *p;
  int *piVar1;
  int iVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < nItems - 1U) {
    iVar2 = nItems;
  }
  p->nSize = 0;
  p->nCap = iVar2;
  if (iVar2 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar2 << 2);
  }
  p->pArray = piVar1;
  Vec_IntPush(p,0x11);
  Vec_IntPush(p,0x27);
  Vec_IntPush(p,0x38);
  Vec_IntPush(p,0xdd);
  return p;
}

Assistant:

Vec_Int_t * Gia_ManSimPatStart( int nItems )
{
    Vec_Int_t * vValues = Vec_IntAlloc( nItems );
    Vec_IntPush( vValues, 17 );
    Vec_IntPush( vValues, 39 );
    Vec_IntPush( vValues, 56 );
    Vec_IntPush( vValues, 221 );
    return vValues;
}